

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gs.c
# Opt level: O0

int32 gs_display(char *file,gs_t *gs)

{
  int32 iVar1;
  gs_t *gs_00;
  FILE *pFVar2;
  bitvec_t *val;
  float32 fVar3;
  bitvec_t *bv;
  float32 tmp;
  int32 c_id;
  int32 s_id;
  int32 m_id;
  int32 code_id;
  int32 i;
  gs_t *gs_local;
  char *file_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,100,"Reading gaussian selector map: %s\n",file);
  gs_00 = (gs_t *)__ckd_calloc__(1,0x40,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
                                 ,0x65);
  pFVar2 = fopen(file,"rb");
  gs_00->fp = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x68,"fopen(%s,rb) failed\n",file);
    exit(1);
  }
  iVar1 = gs_fread_int32(gs_00);
  gs_00->n_mgau = iVar1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,0x6c,"The number of mixtures of gaussian: %d\n",(ulong)(uint)gs_00->n_mgau);
  iVar1 = gs_fread_int32(gs_00);
  gs_00->n_feat = iVar1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,0x6e,"The number of features stream: %d\n",(ulong)(uint)gs_00->n_feat);
  iVar1 = gs_fread_int32(gs_00);
  gs_00->n_density = iVar1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,0x70,"The number of density: %d\n",(ulong)(uint)gs_00->n_density);
  iVar1 = gs_fread_int32(gs_00);
  gs_00->n_code = iVar1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,0x72,"The number of code word: %d\n",(ulong)(uint)gs_00->n_code);
  iVar1 = gs_fread_int32(gs_00);
  gs_00->n_featlen = iVar1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,0x74,"The feature length: %d\n",(ulong)(uint)gs_00->n_featlen);
  gs_00->n_mbyte = (gs_00->n_density + 0x1f) / 0x20 << 2;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,0x76,"The number of byte to read: %d\n",(ulong)(uint)gs_00->n_mbyte);
  val = (bitvec_t *)
        __ckd_calloc__((long)((gs_00->n_density + 0x1f) / 0x20),4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
                       ,0x79);
  for (s_id = 0; s_id < gs_00->n_code; s_id = s_id + 1) {
    printf("Code idx: %d\n",(ulong)(uint)s_id);
    for (bv._4_4_ = 0; bv._4_4_ < gs_00->n_featlen; bv._4_4_ = bv._4_4_ + 1) {
      fVar3 = gs_fread_float32(gs_00);
      printf("%f ",(double)(float)fVar3);
    }
    printf("\n");
    for (c_id = 0; c_id < gs_00->n_mgau; c_id = c_id + 1) {
      for (tmp = 0.0; (int)tmp < gs_00->n_feat; tmp = (float32)((int)tmp + 1)) {
        gs_fread_bitvec_t(val,gs_00);
        printf("%d %d ",(ulong)(uint)c_id,(ulong)(uint)tmp);
        for (m_id = 0; m_id < gs_00->n_density; m_id = m_id + 1) {
          if (((ulong)val[m_id / 0x20] & 1L << ((byte)m_id & 0x1f)) != 0) {
            printf("%d ",(ulong)(uint)m_id);
          }
        }
        printf("\n");
      }
    }
  }
  printf("\n");
  gs_free(gs_00);
  return 1;
}

Assistant:

int
gs_display(char *file, gs_t * gs)
{
    int32 i;
    int32 code_id;
    int32 m_id, s_id, c_id;
    float32 tmp;
    bitvec_t *bv;

    E_INFO("Reading gaussian selector map: %s\n", file);
    gs = (gs_t *) ckd_calloc(1, sizeof(gs_t));

    if ((gs->fp = fopen(file, "rb")) == NULL)
        E_FATAL("fopen(%s,rb) failed\n", file);

    gs->n_mgau = gs_fread_int32(gs);

    E_INFO("The number of mixtures of gaussian: %d\n", gs->n_mgau);
    gs->n_feat = gs_fread_int32(gs);
    E_INFO("The number of features stream: %d\n", gs->n_feat);
    gs->n_density = gs_fread_int32(gs);
    E_INFO("The number of density: %d\n", gs->n_density);
    gs->n_code = gs_fread_int32(gs);
    E_INFO("The number of code word: %d\n", gs->n_code);
    gs->n_featlen = gs_fread_int32(gs);
    E_INFO("The feature length: %d\n", gs->n_featlen);
    gs->n_mbyte = bitvec_size(gs->n_density) * sizeof(bitvec_t);
    E_INFO("The number of byte to read: %d\n", gs->n_mbyte);

    /* allocate the bit vector here */
    bv = bitvec_alloc(gs->n_density);

    /*  for(i=0;i<gs->n_code;i++) */
    for (code_id = 0; code_id < gs->n_code; code_id++) {
        printf("Code idx: %d\n", code_id);
        for (c_id = 0; c_id < gs->n_featlen; c_id++) {
            tmp = gs_fread_float32(gs);
            printf("%f ", tmp);
        }
        printf("\n");
        for (m_id = 0; m_id < gs->n_mgau; m_id++) {
            for (s_id = 0; s_id < gs->n_feat; s_id++) {
                /*The writer currently doesn't support the byte order */
                gs_fread_bitvec_t(bv, gs);
                printf("%d %d ", m_id, s_id);

                for (i = 0; i < gs->n_density; i++) {
                    if (bitvec_is_set(bv, i)) {
                        printf("%d ", i);
                    }
                }
                printf("\n");
            }
        }
    }

    printf("\n");
    /*  bitvec_free(bv); */
    /* destroy the bit vector here */

    gs_free(gs);
    return 1;
}